

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

uint secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  uint count_local;
  uint offset_local;
  secp256k1_scalar *a_local;
  
  if ((offset + count) - 1 >> 6 == offset >> 6) {
    a_local._4_4_ = secp256k1_scalar_get_bits(a,offset,count);
  }
  else {
    a_local._4_4_ =
         ((uint)(a->d[offset >> 6] >> ((byte)offset & 0x3f)) |
         (uint)(a->d[(offset >> 6) + 1] << (0x40 - ((byte)offset & 0x3f) & 0x3f))) &
         (int)(1L << ((byte)count & 0x3f)) - 1U;
  }
  return a_local._4_4_;
}

Assistant:

SECP256K1_INLINE static unsigned int secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    VERIFY_CHECK(count < 32);
    VERIFY_CHECK(offset + count <= 256);
    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & ((((uint64_t)1) << count) - 1);
    }
}